

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O1

QDataStream * operator<<(QDataStream *ds,QTimeZone *tz)

{
  int iVar1;
  QTimeZonePrivate *pQVar2;
  QArrayData *data;
  bool bVar3;
  QDataStream *this;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QString local_58;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((ulong)tz->d & 3) != 0) ||
     (((tz->d).d != (QTimeZonePrivate *)0x0 && (bVar3 = QTimeZonePrivate::isValid((tz->d).d), bVar3)
      ))) {
    if (((ulong)(tz->d).d & 3) == 0) {
      pQVar2 = (tz->d).d;
      if (pQVar2 != (QTimeZonePrivate *)0x0) {
        (*pQVar2->_vptr_QTimeZonePrivate[0x18])(pQVar2,ds);
      }
      goto switchD_00359950_caseD_3;
    }
    switch((int)(tz->d).d - 1U & 3) {
    case 0:
      ba.m_data = (storage_type *)&switchD_00359950::switchdataD_0058c874;
      ba.m_size = (qsizetype)"QTimeZone::LocalTime";
      QString::fromLatin1(&local_38,(QString *)0x14,ba);
      local_58.d.d = local_38.d.d;
      local_58.d.ptr = local_38.d.ptr;
      local_58.d.size = local_38.d.size;
      operator<<(ds,&local_58);
      break;
    case 1:
      ba_00.m_data = (storage_type *)&switchD_00359950::switchdataD_0058c874;
      ba_00.m_size = (qsizetype)"QTimeZone::UTC";
      QString::fromLatin1(&local_38,(QString *)0xe,ba_00);
      local_58.d.d = local_38.d.d;
      local_58.d.ptr = local_38.d.ptr;
      local_58.d.size = local_38.d.size;
      operator<<(ds,&local_58);
      break;
    case 2:
      ba_01.m_data = (storage_type *)&switchD_00359950::switchdataD_0058c874;
      ba_01.m_size = (qsizetype)"AheadOfUtcBy";
      QString::fromLatin1(&local_38,(QString *)0xc,ba_01);
      local_58.d.d = local_38.d.d;
      local_58.d.ptr = local_38.d.ptr;
      local_58.d.size = local_38.d.size;
      this = operator<<(ds,&local_58);
      QDataStream::operator<<(this,(qint32)((ulong)(tz->d).d >> 2));
      break;
    case 3:
      goto switchD_00359950_caseD_3;
    }
    if (&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) goto switchD_00359950_caseD_3;
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    data = &(local_58.d.d)->super_QArrayData;
  }
  else {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = L"-No Time Zone Specified!";
    local_38.d.size = 0x18;
    operator<<(ds,&local_38);
    if (&(local_38.d.d)->super_QArrayData == (QArrayData *)0x0) goto switchD_00359950_caseD_3;
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    data = &(local_38.d.d)->super_QArrayData;
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(data,2,0x10);
  }
switchD_00359950_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return ds;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &ds, const QTimeZone &tz)
{
    const auto toQString = [](const char *text) {
        return QString(QLatin1StringView(text));
    };
    if (tz.isValid())
        tz.d.serialize(ds, toQString);
    else
        ds << invalidId();
    return ds;
}